

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
* __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
           *__return_storage_ptr__,v8 *this,unsigned_short *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4)

{
  uchar *args_local_4;
  uchar *args_local_3;
  uchar *args_local_2;
  uchar *args_local_1;
  unsigned_short *args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  uint *arg;
  longlong local_1e8;
  size_t local_1e0;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_const_4;
  bool formattable_char_4;
  uint *arg_4;
  longlong local_1b8;
  size_t local_1b0;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  uint *arg_3;
  longlong local_188;
  size_t local_180;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  uint *arg_2;
  longlong local_158;
  size_t local_150;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  uint *arg_1;
  longlong local_128;
  size_t local_120;
  
  local_1e8._0_4_ = (uint)*(ushort *)this;
  local_128._0_4_ = (uint)(byte)*args;
  local_158._0_4_ = (uint)*args_1;
  local_188._0_4_ = (uint)*args_2;
  local_1b8._0_4_ = (uint)*args_3;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_1e8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_1e0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_128;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_120;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_158;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_150;
  (__return_storage_ptr__->data_).args_[3].field_0.long_long_value = local_188;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_180;
  (__return_storage_ptr__->data_).args_[4].field_0.long_long_value = local_1b8;
  (__return_storage_ptr__->data_).args_[4].field_0.string.size = local_1b0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}